

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O3

int cfg_tobin_bitmap256(void *reference,size_t bin_size,const_strarray *value)

{
  ulong *puVar1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  size_t sVar6;
  char *__s1;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  
  iVar3 = -1;
  if (bin_size == 0x20) {
    *(undefined1 (*) [16])((long)reference + 0x10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])reference = (undefined1  [16])0x0;
    __s1 = value->value;
    if ((__s1 != (char *)0x0) && (__s1 < value->value + value->length)) {
      piVar4 = __errno_location();
      do {
        *piVar4 = 0;
        iVar3 = strcasecmp(__s1,"all");
        if (iVar3 == 0) {
          uVar10 = 0xffffffff;
          uVar7 = 0xffffffff;
          uVar8 = 0xffffffff;
          uVar9 = 0xffffffff;
LAB_00146305:
          *(undefined4 *)((long)reference + 0x10) = uVar7;
          *(undefined4 *)((long)reference + 0x14) = uVar8;
          *(undefined4 *)((long)reference + 0x18) = uVar9;
          *(undefined4 *)((long)reference + 0x1c) = uVar10;
          *(undefined4 *)reference = uVar7;
          *(undefined4 *)((long)reference + 4) = uVar8;
          *(undefined4 *)((long)reference + 8) = uVar9;
          *(undefined4 *)((long)reference + 0xc) = uVar10;
        }
        else {
          iVar3 = strcasecmp(__s1,"none");
          if (iVar3 == 0) {
            uVar7 = 0;
            uVar8 = 0;
            uVar9 = 0;
            uVar10 = 0;
            goto LAB_00146305;
          }
          if (*__s1 == '-') {
            lVar5 = strtol(__s1 + 1,(char **)0x0,10);
            if (*piVar4 == 0) {
              bVar2 = (byte)lVar5 & 0x3f;
              puVar1 = (ulong *)((long)reference + (ulong)((uint)lVar5 >> 3 & 0x18));
              *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
            }
          }
          else {
            lVar5 = strtol(__s1,(char **)0x0,10);
            if (*piVar4 == 0) {
              puVar1 = (ulong *)((long)reference + (ulong)((uint)lVar5 >> 3 & 0x18));
              *puVar1 = *puVar1 | 1L << ((byte)lVar5 & 0x3f);
            }
          }
        }
        sVar6 = strlen(__s1);
        __s1 = __s1 + sVar6 + 1;
      } while (__s1 < value->value + value->length);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
cfg_tobin_bitmap256(void *reference, size_t bin_size, const struct const_strarray *value) {
  struct bitmap256 *bitmap;
  const char *ptr;
  int idx;

  if (bin_size != sizeof(*bitmap)) {
    return -1;
  }

  bitmap = (struct bitmap256 *)reference;
  memset(bitmap, 0, sizeof(*bitmap));

  strarray_for_each_element(value, ptr) {
    errno = 0;
    if (strcasecmp(ptr, BITMAP256_ALL) == 0) {
      memset(bitmap, 255, sizeof(*bitmap));
    }
    else if (strcasecmp(ptr, BITMAP256_NONE) == 0) {
      memset(bitmap, 0, sizeof(*bitmap));
    }
    else if (*ptr == '-') {
      idx = strtol(&ptr[1], NULL, 10);
      if (!errno) {
        bitmap256_reset(bitmap, idx);
      }
    }
    else {
      idx = strtol(ptr, NULL, 10);
      if (!errno) {
        bitmap256_set(bitmap, idx);
      }
    }
  }
  return 0;
}